

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs-poll.c
# Opt level: O0

int uv_fs_poll_stop(uv_fs_poll_t *handle)

{
  long *plVar1;
  poll_ctx *ctx;
  uv_fs_poll_t *handle_local;
  
  if ((handle->flags & 4) != 0) {
    plVar1 = (long *)handle->poll_ctx;
    if (plVar1 == (long *)0x0) {
      __assert_fail("ctx != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Utilities/cmlibuv/src/fs-poll.c"
                    ,0x6f,"int uv_fs_poll_stop(uv_fs_poll_t *)");
    }
    if (*plVar1 == 0) {
      __assert_fail("ctx->parent_handle != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Utilities/cmlibuv/src/fs-poll.c"
                    ,0x70,"int uv_fs_poll_stop(uv_fs_poll_t *)");
    }
    *plVar1 = 0;
    handle->poll_ctx = (void *)0x0;
    if ((*(uint *)(plVar1 + 0x10) & 4) != 0) {
      uv_close((uv_handle_t *)(plVar1 + 5),timer_close_cb);
    }
    if (((handle->flags & 4) != 0) &&
       (handle->flags = handle->flags & 0xfffffffb, (handle->flags & 8) != 0)) {
      handle->loop->active_handles = handle->loop->active_handles - 1;
    }
  }
  return 0;
}

Assistant:

int uv_fs_poll_stop(uv_fs_poll_t* handle) {
  struct poll_ctx* ctx;

  if (!uv__is_active(handle))
    return 0;

  ctx = handle->poll_ctx;
  assert(ctx != NULL);
  assert(ctx->parent_handle != NULL);
  ctx->parent_handle = NULL;
  handle->poll_ctx = NULL;

  /* Close the timer if it's active. If it's inactive, there's a stat request
   * in progress and poll_cb will take care of the cleanup.
   */
  if (uv__is_active(&ctx->timer_handle))
    uv_close((uv_handle_t*)&ctx->timer_handle, timer_close_cb);

  uv__handle_stop(handle);

  return 0;
}